

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O3

void __thiscall
ValidatorTest_MissingCatchTag_Test::TestBody(ValidatorTest_MissingCatchTag_Test *this)

{
  __node_base_ptr *this_00;
  byte bVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  Expression *item;
  char *in_R9;
  undefined1 auVar4 [16];
  Name item_00;
  undefined1 local_640 [8];
  Module module;
  HeapType local_218;
  undefined4 local_210;
  void *local_208;
  undefined8 uStack_200;
  long local_1f8;
  undefined1 *local_1f0;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_1e8;
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_1b0;
  _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_178;
  undefined1 local_12c;
  undefined1 local_114;
  _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_110;
  _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_d8;
  undefined4 uStack_a0;
  undefined8 uStack_9c;
  undefined8 local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_88;
  undefined2 local_80;
  string local_78;
  internal local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  AssertHelper local_40;
  undefined1 local_31 [8];
  WasmValidator validator;
  
  ::wasm::Module::Module((Module *)local_640);
  module.debugInfoSourcesContent.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ =
       (byte)module.debugInfoSourcesContent.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage | 0x40;
  this_00 = &module.typeIndices._M_h._M_single_bucket;
  puVar2 = (undefined1 *)MixedArena::allocSpace((MixedArena *)this_00,0x78,8);
  *puVar2 = 0x34;
  *(undefined8 *)(puVar2 + 0x28) = 0;
  *(undefined8 *)(puVar2 + 0x30) = 0;
  *(undefined8 *)(puVar2 + 0x38) = 0;
  *(undefined8 *)(puVar2 + 8) = 0;
  *(undefined8 *)(puVar2 + 0x10) = 0;
  *(undefined8 *)(puVar2 + 0x18) = 0;
  *(__node_base_ptr **)(puVar2 + 0x40) = this_00;
  *(undefined8 *)(puVar2 + 0x48) = 0;
  *(undefined8 *)(puVar2 + 0x50) = 0;
  *(undefined8 *)(puVar2 + 0x58) = 0;
  *(__node_base_ptr **)(puVar2 + 0x60) = this_00;
  *(undefined8 *)(puVar2 + 0x68) = 0;
  *(undefined8 *)(puVar2 + 0x70) = 0;
  auVar4 = ::wasm::IString::interned(4,"tst1",0);
  *(undefined1 (*) [16])(puVar2 + 0x10) = auVar4;
  puVar3 = (undefined1 *)MixedArena::allocSpace((MixedArena *)this_00,0x28,8);
  *puVar3 = 0xe;
  *(undefined8 *)(puVar3 + 8) = 0;
  *(undefined8 *)(puVar3 + 0x10) = 0;
  *(undefined8 *)(puVar3 + 0x18) = 0;
  *(undefined8 *)(puVar3 + 0x20) = 0;
  module.tagsMap._M_h._M_single_bucket._0_4_ = 1;
  ::wasm::Literal::operator=
            ((Literal *)(puVar3 + 0x10),(Literal *)&module.tagsMap._M_h._M_single_bucket);
  ::wasm::Literal::~Literal((Literal *)&module.tagsMap._M_h._M_single_bucket);
  *(undefined1 **)(puVar2 + 0x20) = puVar3;
  item_00.super_IString.str = (IString)::wasm::IString::interned(3,"foo",0);
  ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::push_back
            ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(puVar2 + 0x28),item_00);
  item = (Expression *)MixedArena::allocSpace((MixedArena *)this_00,0x28,8);
  item->_id = ConstId;
  (item->type).id = 0;
  *(undefined8 *)(item + 1) = 0;
  item[1].type.id = 0;
  *(undefined8 *)(item + 2) = 0;
  module.tagsMap._M_h._M_single_bucket._0_4_ = 2;
  ::wasm::Literal::operator=((Literal *)(item + 1),(Literal *)&module.tagsMap._M_h._M_single_bucket)
  ;
  ::wasm::Literal::~Literal((Literal *)&module.tagsMap._M_h._M_single_bucket);
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)(puVar2 + 0x48)
             ,item);
  memset(&module.tagsMap._M_h._M_single_bucket,0,0x1d8);
  ::wasm::HeapType::HeapType(&local_218,(Signature)ZEXT816(0));
  local_1e8._M_buckets = &local_1e8._M_single_bucket;
  local_210 = 0;
  local_208 = (void *)0x0;
  uStack_200 = 0;
  local_1f8 = 0;
  local_1e8._M_bucket_count = 1;
  local_1e8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1e8._M_element_count = 0;
  local_1e8._M_rehash_policy._M_max_load_factor = 1.0;
  local_1e8._M_rehash_policy._M_next_resize = 0;
  local_1e8._M_single_bucket = (__node_base_ptr)0x0;
  local_1b0._M_buckets = &local_1b0._M_single_bucket;
  local_1b0._M_bucket_count = 1;
  local_1b0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1b0._M_element_count = 0;
  local_1b0._M_rehash_policy._M_max_load_factor = 1.0;
  local_1b0._M_rehash_policy._M_next_resize = 0;
  local_1b0._M_single_bucket = (__node_base_ptr)0x0;
  local_178._M_buckets = &local_178._M_single_bucket;
  local_178._M_bucket_count = 1;
  local_178._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_178._M_element_count = 0;
  local_178._M_rehash_policy._M_max_load_factor = 1.0;
  local_178._M_rehash_policy._M_next_resize = 0;
  local_178._M_single_bucket = (__node_base_ptr)0x0;
  local_12c = 0;
  local_114 = 0;
  local_110._M_buckets = &local_110._M_single_bucket;
  local_110._M_bucket_count = 1;
  local_110._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_110._M_element_count = 0;
  local_110._M_rehash_policy._M_max_load_factor = 1.0;
  local_110._M_rehash_policy._M_next_resize = 0;
  local_110._M_single_bucket = (__node_base_ptr)0x0;
  local_d8._M_buckets = &local_d8._M_single_bucket;
  local_d8._M_bucket_count = 1;
  local_d8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_d8._M_element_count = 0;
  local_d8._M_rehash_policy._M_max_load_factor = 1.0;
  uStack_a0 = 0;
  uStack_9c = 0;
  local_d8._M_rehash_policy._M_next_resize = 0;
  local_d8._M_single_bucket._0_4_ = 0;
  local_d8._M_single_bucket._4_4_ = 0;
  local_90 = 0;
  p_Stack_88 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_80 = 0;
  local_1f0 = puVar2;
  bVar1 = ::wasm::WasmValidator::validate
                    ((Function *)local_31,(Module *)&module.tagsMap._M_h._M_single_bucket,
                     (uint)local_640);
  local_58[0] = (internal)(bVar1 ^ 1);
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1 != 0) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_78,local_58,(AssertionResult *)"validator.validate(&function, module, flags)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/validator.cpp"
               ,0x31,local_78._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
    if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_50,local_50);
    }
  }
  if (p_Stack_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_88);
  }
  std::
  _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_d8);
  std::
  _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_110);
  std::
  _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_178);
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_1b0);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_1e8);
  if (local_208 != (void *)0x0) {
    operator_delete(local_208,local_1f8 - (long)local_208);
  }
  ::wasm::Module::~Module((Module *)local_640);
  return;
}

Assistant:

TEST(ValidatorTest, MissingCatchTag) {
  WasmValidator validator;
  Module module;
  module.features.enable(FeatureSet::ExceptionHandling);
  auto tryExp = module.allocator.alloc<Try>();
  tryExp->name = "tst1";
  auto bodyExp = module.allocator.alloc<Const>();
  bodyExp->value = Literal(1);
  tryExp->body = bodyExp;
  tryExp->catchTags.push_back(wasm::Name("foo"));
  auto catchBodyExp = module.allocator.alloc<Const>();
  catchBodyExp->value = Literal(2);
  tryExp->catchBodies.push_back(catchBodyExp);
  Function function = Function();
  function.body = tryExp;
  WasmValidator::Flags flags =
    WasmValidator::FlagValues::Globally | WasmValidator::FlagValues::Quiet;
  EXPECT_FALSE(validator.validate(&function, module, flags));
}